

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

int SUNLinSolSetPreconditioner(SUNLinearSolver S,void *P_data,SUNPSetupFn Pset,SUNPSolveFn Psol)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int ier;
  undefined4 local_24;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x18) == 0) {
    local_24 = 0;
  }
  else {
    local_24 = (**(code **)(*(long *)(in_RDI + 8) + 0x18))(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_24;
}

Assistant:

int SUNLinSolSetPreconditioner(SUNLinearSolver S, void* P_data,
                               SUNPSetupFn Pset, SUNPSolveFn Psol)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->setpreconditioner)
    ier = S->ops->setpreconditioner(S, P_data, Pset, Psol);
  else
    ier = SUNLS_SUCCESS;
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return(ier);
}